

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ProcessRTCPCompoundPacket
          (RTPSources *this,RTCPCompoundPacket *rtcpcomppack,RTPTime *receivetime,
          RTPAddress *senderaddress)

{
  RTCPSDESPacket *this_00;
  bool bVar1;
  uint8_t uVar2;
  bool bVar3;
  PacketType PVar4;
  uint32_t uVar5;
  int32_t iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  ItemType t_00;
  int iVar10;
  uint32_t uVar11;
  size_t valuelen;
  uint8_t *valuedata;
  size_t sVar12;
  uint8_t *puVar13;
  uint32_t local_cc;
  RTCPAPPPacket *p_4;
  uint32_t byessrc;
  int num_2;
  int i_2;
  RTCPBYEPacket *p_3;
  ItemType t;
  bool updated;
  uint32_t sdesssrc;
  RTCPSDESPacket *p_2;
  int num_1;
  int i_1;
  bool gotinfo_1;
  uint32_t senderssrc_1;
  RTCPRRPacket *p_1;
  int num;
  int i;
  bool gotinfo;
  uint32_t local_5c;
  RTCPSDESPacket *pRStack_58;
  uint32_t senderssrc;
  RTCPSRPacket *p;
  byte local_45;
  uint32_t ownssrc;
  bool gotownssrc;
  RTCPSDESPacket *pRStack_40;
  int status;
  RTCPPacket *rtcppack;
  RTPAddress *senderaddress_local;
  RTPTime *receivetime_local;
  RTCPCompoundPacket *rtcpcomppack_local;
  RTPSources *this_local;
  
  local_45 = -(this->owndata != (RTPInternalSourceData *)0x0) & 1;
  rtcppack = (RTCPPacket *)senderaddress;
  senderaddress_local = (RTPAddress *)receivetime;
  receivetime_local = (RTPTime *)rtcpcomppack;
  rtcpcomppack_local = (RTCPCompoundPacket *)this;
  if (this->owndata == (RTPInternalSourceData *)0x0) {
    local_cc = 0;
  }
  else {
    local_cc = RTPSourceData::GetSSRC(&this->owndata->super_RTPSourceData);
  }
  p._4_4_ = local_cc;
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[3])
            (this,receivetime_local,senderaddress_local,rtcppack);
  RTCPCompoundPacket::GotoFirstPacket((RTCPCompoundPacket *)receivetime_local);
LAB_00149675:
  do {
    while( true ) {
      pRStack_40 = (RTCPSDESPacket *)
                   RTCPCompoundPacket::GetNextPacket((RTCPCompoundPacket *)receivetime_local);
      if (pRStack_40 == (RTCPSDESPacket *)0x0) {
        return 0;
      }
      bVar1 = RTCPPacket::IsKnownFormat((RTCPPacket *)pRStack_40);
      if (bVar1) break;
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x11])
                (this,pRStack_40,senderaddress_local,rtcppack);
    }
    PVar4 = RTCPPacket::GetPacketType(&pRStack_40->super_RTCPPacket);
    this_00 = pRStack_40;
    switch(PVar4) {
    case SR:
      pRStack_58 = pRStack_40;
      uVar11 = RTCPSRPacket::GetSenderSSRC((RTCPSRPacket *)pRStack_40);
      local_5c = uVar11;
      _i = RTCPSRPacket::GetNTPTimestamp((RTCPSRPacket *)pRStack_58);
      uVar5 = RTCPSRPacket::GetRTPTimestamp((RTCPSRPacket *)pRStack_58);
      uVar7 = RTCPSRPacket::GetSenderPacketCount((RTCPSRPacket *)pRStack_58);
      uVar8 = RTCPSRPacket::GetSenderOctetCount((RTCPSRPacket *)pRStack_58);
      ownssrc = ProcessRTCPSenderInfo
                          (this,uVar11,(RTPNTPTime *)&i,uVar5,uVar7,uVar8,
                           (RTPTime *)senderaddress_local,(RTPAddress *)rtcppack);
      if ((int)ownssrc < 0) {
        return ownssrc;
      }
      bVar1 = false;
      if ((local_45 & 1) != 0) {
        iVar10 = RTCPSRPacket::GetReceptionReportCount((RTCPSRPacket *)pRStack_58);
        for (p_1._4_4_ = 0; p_1._4_4_ < iVar10; p_1._4_4_ = p_1._4_4_ + 1) {
          uVar5 = RTCPSRPacket::GetSSRC((RTCPSRPacket *)pRStack_58,p_1._4_4_);
          uVar11 = local_5c;
          if (uVar5 == p._4_4_) {
            bVar1 = true;
            uVar2 = RTCPSRPacket::GetFractionLost((RTCPSRPacket *)pRStack_58,p_1._4_4_);
            iVar6 = RTCPSRPacket::GetLostPacketCount((RTCPSRPacket *)pRStack_58,p_1._4_4_);
            uVar5 = RTCPSRPacket::GetExtendedHighestSequenceNumber
                              ((RTCPSRPacket *)pRStack_58,p_1._4_4_);
            uVar7 = RTCPSRPacket::GetJitter((RTCPSRPacket *)pRStack_58,p_1._4_4_);
            uVar8 = RTCPSRPacket::GetLSR((RTCPSRPacket *)pRStack_58,p_1._4_4_);
            uVar9 = RTCPSRPacket::GetDLSR((RTCPSRPacket *)pRStack_58,p_1._4_4_);
            ownssrc = ProcessRTCPReportBlock
                                (this,uVar11,uVar2,iVar6,uVar5,uVar7,uVar8,uVar9,
                                 (RTPTime *)senderaddress_local,(RTPAddress *)rtcppack);
            if ((int)ownssrc < 0) {
              return ownssrc;
            }
          }
        }
      }
      if (bVar1) goto LAB_00149675;
      ownssrc = UpdateReceiveTime(this,local_5c,(RTPTime *)senderaddress_local,
                                  (RTPAddress *)rtcppack);
      break;
    case RR:
      uVar11 = RTCPRRPacket::GetSenderSSRC((RTCPRRPacket *)pRStack_40);
      bVar1 = false;
      if ((local_45 & 1) != 0) {
        iVar10 = RTCPRRPacket::GetReceptionReportCount((RTCPRRPacket *)this_00);
        for (p_2._4_4_ = 0; p_2._4_4_ < iVar10; p_2._4_4_ = p_2._4_4_ + 1) {
          uVar5 = RTCPRRPacket::GetSSRC((RTCPRRPacket *)this_00,p_2._4_4_);
          if (uVar5 == p._4_4_) {
            bVar1 = true;
            uVar2 = RTCPRRPacket::GetFractionLost((RTCPRRPacket *)this_00,p_2._4_4_);
            iVar6 = RTCPRRPacket::GetLostPacketCount((RTCPRRPacket *)this_00,p_2._4_4_);
            uVar5 = RTCPRRPacket::GetExtendedHighestSequenceNumber
                              ((RTCPRRPacket *)this_00,p_2._4_4_);
            uVar7 = RTCPRRPacket::GetJitter((RTCPRRPacket *)this_00,p_2._4_4_);
            uVar8 = RTCPRRPacket::GetLSR((RTCPRRPacket *)this_00,p_2._4_4_);
            uVar9 = RTCPRRPacket::GetDLSR((RTCPRRPacket *)this_00,p_2._4_4_);
            ownssrc = ProcessRTCPReportBlock
                                (this,uVar11,uVar2,iVar6,uVar5,uVar7,uVar8,uVar9,
                                 (RTPTime *)senderaddress_local,(RTPAddress *)rtcppack);
            if ((int)ownssrc < 0) {
              return ownssrc;
            }
          }
        }
      }
      if (bVar1) goto LAB_00149675;
      ownssrc = UpdateReceiveTime(this,uVar11,(RTPTime *)senderaddress_local,(RTPAddress *)rtcppack)
      ;
      break;
    case SDES:
      bVar1 = RTCPSDESPacket::GotoFirstChunk(pRStack_40);
      if (bVar1) {
        do {
          uVar11 = RTCPSDESPacket::GetChunkSSRC(this_00);
          bVar1 = false;
          bVar3 = RTCPSDESPacket::GotoFirstItem(this_00);
          if (bVar3) {
            do {
              t_00 = RTCPSDESPacket::GetItemType(this_00);
              if (t_00 == PRIV) {
                sVar12 = RTCPSDESPacket::GetPRIVPrefixLength(this_00);
                puVar13 = RTCPSDESPacket::GetPRIVPrefixData(this_00);
                valuelen = RTCPSDESPacket::GetPRIVValueLength(this_00);
                valuedata = RTCPSDESPacket::GetPRIVValueData(this_00);
                ownssrc = ProcessSDESPrivateItem
                                    (this,uVar11,sVar12,puVar13,valuelen,valuedata,
                                     (RTPTime *)senderaddress_local,(RTPAddress *)rtcppack);
              }
              else {
                sVar12 = RTCPSDESPacket::GetItemLength(this_00);
                puVar13 = RTCPSDESPacket::GetItemData(this_00);
                ownssrc = ProcessSDESNormalItem
                                    (this,uVar11,t_00,sVar12,puVar13,(RTPTime *)senderaddress_local,
                                     (RTPAddress *)rtcppack);
              }
              if ((int)ownssrc < 0) {
                return ownssrc;
              }
              bVar1 = true;
              bVar3 = RTCPSDESPacket::GotoNextItem(this_00);
            } while (bVar3);
          }
          if ((!bVar1) &&
             (ownssrc = UpdateReceiveTime(this,uVar11,(RTPTime *)senderaddress_local,
                                          (RTPAddress *)rtcppack), (int)ownssrc < 0)) {
            return ownssrc;
          }
          bVar1 = RTCPSDESPacket::GotoNextChunk(this_00);
        } while (bVar1);
      }
      goto LAB_00149675;
    case BYE:
      iVar10 = RTCPBYEPacket::GetSSRCCount((RTCPBYEPacket *)pRStack_40);
      for (byessrc = 0; (int)byessrc < iVar10; byessrc = byessrc + 1) {
        uVar11 = RTCPBYEPacket::GetSSRC((RTCPBYEPacket *)this_00,byessrc);
        sVar12 = RTCPBYEPacket::GetReasonLength((RTCPBYEPacket *)this_00);
        puVar13 = RTCPBYEPacket::GetReasonData((RTCPBYEPacket *)this_00);
        ownssrc = ProcessBYE(this,uVar11,sVar12,puVar13,(RTPTime *)senderaddress_local,
                             (RTPAddress *)rtcppack);
        if ((int)ownssrc < 0) {
          return ownssrc;
        }
      }
      goto LAB_00149675;
    case APP:
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xf])
                (this,pRStack_40,senderaddress_local,rtcppack);
      goto LAB_00149675;
    case Unknown:
    default:
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x10])
                (this,pRStack_40,senderaddress_local,rtcppack);
      goto LAB_00149675;
    }
    if ((int)ownssrc < 0) {
      return ownssrc;
    }
  } while( true );
}

Assistant:

int RTPSources::ProcessRTCPCompoundPacket(RTCPCompoundPacket *rtcpcomppack,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTCPPacket *rtcppack;
	int status;
	bool gotownssrc = ((owndata == 0)?false:true);
	uint32_t ownssrc = ((owndata != 0)?owndata->GetSSRC():0);
	
	OnRTCPCompoundPacket(rtcpcomppack,receivetime,senderaddress);
	
	rtcpcomppack->GotoFirstPacket();	
	while ((rtcppack = rtcpcomppack->GetNextPacket()) != 0)
	{
		if (rtcppack->IsKnownFormat())
		{
			switch (rtcppack->GetPacketType())
			{
			case RTCPPacket::SR:
				{
					RTCPSRPacket *p = (RTCPSRPacket *)rtcppack;
					uint32_t senderssrc = p->GetSenderSSRC();
					
					status = ProcessRTCPSenderInfo(senderssrc,p->GetNTPTimestamp(),p->GetRTPTimestamp(),
						                       p->GetSenderPacketCount(),p->GetSenderOctetCount(),
								       receivetime,senderaddress);
					if (status < 0)
						return status;
					
					bool gotinfo = false;
					if (gotownssrc)
					{
						int i;
						int num = p->GetReceptionReportCount();
						for (i = 0 ; i < num ; i++)
						{
							if (p->GetSSRC(i) == ownssrc) // data is meant for us
							{
								gotinfo = true;
								status = ProcessRTCPReportBlock(senderssrc,p->GetFractionLost(i),p->GetLostPacketCount(i),
										                        p->GetExtendedHighestSequenceNumber(i),p->GetJitter(i),p->GetLSR(i),
													p->GetDLSR(i),receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						}
					}
					if (!gotinfo)
					{
						status = UpdateReceiveTime(senderssrc,receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::RR:
				{
					RTCPRRPacket *p = (RTCPRRPacket *)rtcppack;
					uint32_t senderssrc = p->GetSenderSSRC();
					
					bool gotinfo = false;

					if (gotownssrc)
					{
						int i;
						int num = p->GetReceptionReportCount();
						for (i = 0 ; i < num ; i++)
						{
							if (p->GetSSRC(i) == ownssrc)
							{
								gotinfo = true;
								status = ProcessRTCPReportBlock(senderssrc,p->GetFractionLost(i),p->GetLostPacketCount(i),
										                        p->GetExtendedHighestSequenceNumber(i),p->GetJitter(i),p->GetLSR(i),
													p->GetDLSR(i),receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						}
					}
					if (!gotinfo)
					{
						status = UpdateReceiveTime(senderssrc,receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::SDES:
				{
					RTCPSDESPacket *p = (RTCPSDESPacket *)rtcppack;
					
					if (p->GotoFirstChunk())
					{
						do
						{
							uint32_t sdesssrc = p->GetChunkSSRC();
							bool updated = false;
							if (p->GotoFirstItem())
							{
								do
								{
									RTCPSDESPacket::ItemType t;
				
									if ((t = p->GetItemType()) != RTCPSDESPacket::PRIV)
									{
										updated = true;
										status = ProcessSDESNormalItem(sdesssrc,t,p->GetItemLength(),p->GetItemData(),receivetime,senderaddress);
										if (status < 0)
											return status;
									}
#ifdef RTP_SUPPORT_SDESPRIV
									else
									{
										updated = true;
										status = ProcessSDESPrivateItem(sdesssrc,p->GetPRIVPrefixLength(),p->GetPRIVPrefixData(),p->GetPRIVValueLength(),
												                        p->GetPRIVValueData(),receivetime,senderaddress);
										if (status < 0)
											return status;
									}
#endif // RTP_SUPPORT_SDESPRIV
								} while (p->GotoNextItem());
							}
							if (!updated)
							{
								status = UpdateReceiveTime(sdesssrc,receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						} while (p->GotoNextChunk());
					}
				}
				break;
			case RTCPPacket::BYE:
				{
					RTCPBYEPacket *p = (RTCPBYEPacket *)rtcppack;
					int i;
					int num = p->GetSSRCCount();

					for (i = 0 ; i < num ; i++)
					{
						uint32_t byessrc = p->GetSSRC(i);
						status = ProcessBYE(byessrc,p->GetReasonLength(),p->GetReasonData(),receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::APP:
				{
					RTCPAPPPacket *p = (RTCPAPPPacket *)rtcppack;

					OnAPPPacket(p,receivetime,senderaddress);
				}
				break; 
			case RTCPPacket::Unknown:
			default:
				{
					OnUnknownPacketType(rtcppack,receivetime,senderaddress);
				}
				break;
			}
		}
		else
		{
			OnUnknownPacketFormat(rtcppack,receivetime,senderaddress);
		}
	}

	return 0;
}